

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_tools.h
# Opt level: O1

bool math::matrix_is_diagonal<double>(double *mat,int rows,int cols,double *epsilon)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  double *pdVar9;
  ulong uVar10;
  long lVar11;
  double *pdVar12;
  bool bVar13;
  
  bVar13 = rows < 1;
  if (0 < rows) {
    dVar2 = *epsilon;
    lVar4 = (long)cols;
    pdVar9 = mat + 2;
    lVar6 = (ulong)(uint)cols - 2;
    lVar5 = 1;
    lVar11 = -1;
    uVar10 = 0;
    pdVar12 = mat;
    do {
      bVar3 = uVar10 == 0 || cols < 1;
      if (uVar10 != 0 && cols >= 1) {
        if ((mat[uVar10 * lVar4] - dVar2 <= 0.0) && (0.0 <= mat[uVar10 * lVar4] + dVar2)) {
          uVar7 = 1;
          do {
            bVar3 = lVar4 <= (long)uVar7 || uVar10 <= uVar7;
            if (bVar3) goto LAB_00110c72;
            pdVar1 = pdVar12 + uVar7;
          } while ((*pdVar1 - dVar2 <= 0.0) && (uVar7 = uVar7 + 1, 0.0 <= *pdVar1 + dVar2));
        }
        if (!bVar3) {
          return bVar13;
        }
      }
LAB_00110c72:
      uVar7 = uVar10 + 1;
      bVar3 = (long)uVar7 < lVar4;
      if ((long)uVar7 < lVar4) {
        if ((mat[lVar5 + uVar10 * lVar4] - dVar2 <= 0.0) &&
           (0.0 <= mat[lVar5 + uVar10 * lVar4] + dVar2)) {
          lVar8 = 0;
          do {
            if (lVar6 == lVar8) goto LAB_00110cdd;
            pdVar1 = pdVar9 + lVar8;
            lVar8 = lVar8 + 1;
          } while ((*pdVar1 - dVar2 <= 0.0) && (0.0 <= *pdVar1 + dVar2));
          bVar3 = lVar8 - lVar11 < lVar4;
        }
        if (bVar3) {
          return bVar13;
        }
      }
LAB_00110cdd:
      bVar13 = (uint)rows <= uVar7;
      lVar5 = lVar5 + 1;
      pdVar12 = pdVar12 + lVar4;
      lVar11 = lVar11 + -1;
      pdVar9 = pdVar9 + lVar4 + 1;
      lVar6 = lVar6 + -1;
      uVar10 = uVar7;
    } while (uVar7 != (uint)rows);
  }
  return bVar13;
}

Assistant:

bool
matrix_is_diagonal (T* const mat, int rows, int cols, T const& epsilon)
{
    for (int y = 0; y < rows; ++y)
    {
        for (int x = 0; x < y && x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
        for (int x = y + 1; x < cols; ++x)
            if (!MATH_EPSILON_EQ(T(0), mat[y * cols + x], epsilon))
                return false;
    }
    return true;
}